

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

void __thiscall CLineInput::UpdateStrData(CLineInput *this)

{
  CLineInput *in_RDI;
  char *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  str_utf8_stats(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int *)in_RDI,
                 (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if ((in_RDI->m_CursorPos < 0) || (in_RDI->m_Len < in_RDI->m_CursorPos)) {
    SetCursorOffset(in_RDI,in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void CLineInput::UpdateStrData()
{
	str_utf8_stats(m_pStr, m_MaxSize, m_MaxChars, &m_Len, &m_NumChars);
	if(m_CursorPos < 0 || m_CursorPos > m_Len)
		SetCursorOffset(m_CursorPos);
}